

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression *
slang::ast::Expression::bindSelector
          (Compilation *compilation,Expression *value,ElementSelectSyntax *syntax,
          ASTContext *context)

{
  SourceRange range;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceLocation startLoc;
  SourceLocation endLoc;
  SourceLocation in_RCX;
  long in_RDX;
  int *in_RSI;
  SourceRange fullRange;
  SelectorSyntax *selector;
  ASTContext *in_stack_00000110;
  ExpressionSyntax *in_stack_00000118;
  Expression *in_stack_00000120;
  Compilation *in_stack_00000128;
  undefined1 in_stack_00000130 [16];
  ASTContext *in_stack_00000520;
  RangeSelectSyntax *in_stack_00000528;
  Expression *in_stack_00000530;
  Compilation *in_stack_00000538;
  SourceRange in_stack_00000540;
  Expression *in_stack_ffffffffffffff08;
  Compilation *in_stack_ffffffffffffff10;
  SourceLocation in_stack_ffffffffffffff18;
  SourceLocation in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  SourceLocation in_stack_ffffffffffffff30;
  SourceLocation in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  DiagCode code;
  SourceLocation in_stack_ffffffffffffff60;
  SourceRange local_80;
  undefined8 local_70;
  undefined8 local_68;
  SourceRange local_60;
  undefined4 local_4c;
  SourceRange local_48;
  undefined4 local_34;
  SyntaxNode *local_30;
  int *local_18;
  Expression *local_8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff40 >> 0x20,0);
  local_30 = *(SyntaxNode **)(in_RDX + 0x28);
  if (local_30 == (SyntaxNode *)0x0) {
    local_34 = 0x10001;
    local_48 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff60);
    sourceRange.endLoc = in_RCX;
    sourceRange.startLoc = in_stack_ffffffffffffff30;
    ASTContext::addDiag((ASTContext *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                        code,sourceRange);
    local_8 = badExpr(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  else if (*in_RSI == 0x13) {
    local_4c = 0x940007;
    local_18 = in_RSI;
    local_60 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff60);
    sourceRange_00.endLoc = in_stack_ffffffffffffff38;
    sourceRange_00.startLoc = in_RCX;
    ASTContext::addDiag((ASTContext *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                        code,sourceRange_00);
    local_70 = *(undefined8 *)(local_18 + 8);
    local_68 = *(undefined8 *)(local_18 + 10);
    range.endLoc = in_stack_ffffffffffffff20;
    range.startLoc = in_stack_ffffffffffffff18;
    Diagnostic::operator<<((Diagnostic *)in_stack_ffffffffffffff10,range);
    local_8 = badExpr(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  else {
    startLoc = SourceRange::start((SourceRange *)(in_RSI + 8));
    slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff60);
    endLoc = SourceRange::end((SourceRange *)&stack0xffffffffffffff60);
    SourceRange::SourceRange(&local_80,startLoc,endLoc);
    if ((local_30->kind == AscendingRangeSelect) || (local_30->kind != BitSelect)) {
      slang::syntax::SyntaxNode::as<slang::syntax::RangeSelectSyntax>(local_30);
      local_8 = RangeSelectExpression::fromSyntax
                          (in_stack_00000538,in_stack_00000530,in_stack_00000528,in_stack_00000540,
                           in_stack_00000520);
    }
    else {
      slang::syntax::SyntaxNode::as<slang::syntax::BitSelectSyntax>(local_30);
      not_null<slang::syntax::ExpressionSyntax_*>::operator*
                ((not_null<slang::syntax::ExpressionSyntax_*> *)0x6fafa1);
      local_8 = ElementSelectExpression::fromSyntax
                          (in_stack_00000128,in_stack_00000120,in_stack_00000118,
                           (SourceRange)in_stack_00000130,in_stack_00000110);
    }
  }
  return local_8;
}

Assistant:

Expression& Expression::bindSelector(Compilation& compilation, Expression& value,
                                     const ElementSelectSyntax& syntax, const ASTContext& context) {
    const SelectorSyntax* selector = syntax.selector;
    if (!selector) {
        context.addDiag(diag::ExpectedExpression, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (value.kind == ExpressionKind::RangeSelect) {
        context.addDiag(diag::SelectAfterRangeSelect, syntax.sourceRange()) << value.sourceRange;
        return badExpr(compilation, nullptr);
    }

    // The full source range of the expression includes the value and the selector syntax.
    SourceRange fullRange = {value.sourceRange.start(), syntax.sourceRange().end()};

    switch (selector->kind) {
        case SyntaxKind::BitSelect:
            return ElementSelectExpression::fromSyntax(compilation, value,
                                                       *selector->as<BitSelectSyntax>().expr,
                                                       fullRange, context);
        case SyntaxKind::SimpleRangeSelect:
        case SyntaxKind::AscendingRangeSelect:
        case SyntaxKind::DescendingRangeSelect:
            return RangeSelectExpression::fromSyntax(compilation, value,
                                                     selector->as<RangeSelectSyntax>(), fullRange,
                                                     context);
        default:
            SLANG_UNREACHABLE;
    }
}